

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtag.cpp
# Opt level: O0

Jtag * __thiscall Jtag::shiftData(Jtag *this,uint bitCount,string *tdi)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  string *in_RCX;
  undefined4 in_register_00000034;
  Jtag *this_00;
  bool local_3a9;
  uint local_32c;
  bool local_2f9;
  string local_288 [35];
  undefined1 local_265;
  int local_264;
  char local_25d;
  int local_25c;
  stringstream local_258 [4];
  int i_2;
  stringstream ss;
  undefined1 local_248 [380];
  uint local_cc;
  allocator local_c5;
  uint i_1;
  allocator local_bf;
  byte local_be;
  allocator local_bd;
  DWORD bytesToRead;
  BYTE lastBit_1;
  allocator local_b5;
  uint partialBits;
  uint local_b0;
  uint i;
  uint bct;
  uint offset;
  uint remBytes;
  uint fullBytes;
  BYTE *local_80;
  BYTE *tdiBytes;
  BYTE lastBit;
  allocator local_6d;
  int data;
  allocator local_5d;
  uint local_5c;
  uint local_58;
  uint reqHex;
  DWORD tdoBytes;
  DWORD dwNumBytesRead;
  DWORD dwNumBytesToRead;
  DWORD dwNumBytesSent;
  BYTE *byInputBuffer;
  BYTE *tdoBuffer;
  BYTE *byOutputBuffer;
  uint reqBytes;
  FT_STATUS ftStatus;
  string *tdi_local;
  Jtag *pJStack_18;
  uint bitCount_local;
  Jtag *this_local;
  string *hexTdo;
  
  this_00 = (Jtag *)CONCAT44(in_register_00000034,bitCount);
  tdi_local._4_4_ = (uint)tdi;
  byOutputBuffer._0_4_ = (tdi_local._4_4_ >> 3) + (uint)(((ulong)tdi & 7) != 0);
  pJStack_18 = this_00;
  this_local = this;
  tdoBuffer = (BYTE *)operator_new__((ulong)((int)byOutputBuffer + 3));
  byInputBuffer = (BYTE *)operator_new__((ulong)((int)byOutputBuffer + 3));
  _dwNumBytesToRead = (byte *)operator_new__((ulong)((int)byOutputBuffer + 6));
  dwNumBytesRead = 0;
  tdoBytes = 0;
  reqHex = 0;
  local_58 = 0;
  local_5c = (tdi_local._4_4_ >> 2) + (uint)((tdi_local._4_4_ & 3) != 0);
  uVar2 = std::__cxx11::string::length();
  if (uVar2 < local_5c) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_5d);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d);
  }
  else {
    bVar1 = flush(this_00);
    if (bVar1) {
      if (tdi_local._4_4_ < 9) {
        tdiBytes._4_4_ = std::__cxx11::stoi(in_RCX,(size_t *)0x0,0x10);
        *tdoBuffer = ';';
        tdoBuffer[1] = (char)tdi_local._4_4_ + 0xfe;
        tdoBuffer[2] = (BYTE)tdiBytes._4_4_;
        byOutputBuffer._4_4_ = FT_Write(this_00->ftHandle,tdoBuffer,3,&dwNumBytesRead);
        if (byOutputBuffer._4_4_ != 0) {
          if (tdoBuffer != (BYTE *)0x0) {
            operator_delete(tdoBuffer,1);
          }
          if (byInputBuffer != (BYTE *)0x0) {
            operator_delete(byInputBuffer,1);
          }
          if (_dwNumBytesToRead != (byte *)0x0) {
            operator_delete(_dwNumBytesToRead,1);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)this,"",(allocator *)((long)&tdiBytes + 3));
          std::allocator<char>::~allocator((allocator<char> *)((long)&tdiBytes + 3));
          return this;
        }
        tdiBytes._2_1_ = (byte)(tdiBytes._4_4_ >> ((char)tdi_local._4_4_ - 1U & 7)) & 1;
        *tdoBuffer = 'n';
        tdoBuffer[1] = '\0';
        tdoBuffer[2] = tdiBytes._2_1_ << 7 | 3;
        byOutputBuffer._4_4_ = FT_Write(this_00->ftHandle,tdoBuffer,3,&dwNumBytesRead);
        if (byOutputBuffer._4_4_ != 0) {
          if (tdoBuffer != (BYTE *)0x0) {
            operator_delete(tdoBuffer,1);
          }
          if (byInputBuffer != (BYTE *)0x0) {
            operator_delete(byInputBuffer,1);
          }
          if (_dwNumBytesToRead != (byte *)0x0) {
            operator_delete(_dwNumBytesToRead,1);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)this,"",(allocator *)((long)&tdiBytes + 1));
          std::allocator<char>::~allocator((allocator<char> *)((long)&tdiBytes + 1));
          return this;
        }
        byOutputBuffer._4_4_ = 0;
        do {
          byOutputBuffer._4_4_ = FT_GetQueueStatus(this_00->ftHandle,&tdoBytes);
          local_2f9 = tdoBytes == 0 && byOutputBuffer._4_4_ == 0;
        } while (local_2f9);
        byOutputBuffer._4_4_ = FT_Read(this_00->ftHandle,_dwNumBytesToRead,tdoBytes,&reqHex);
        if (byOutputBuffer._4_4_ != 0) {
          if (tdoBuffer != (BYTE *)0x0) {
            operator_delete(tdoBuffer,1);
          }
          if (byInputBuffer != (BYTE *)0x0) {
            operator_delete(byInputBuffer,1);
          }
          if (_dwNumBytesToRead != (byte *)0x0) {
            operator_delete(_dwNumBytesToRead,1);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)this,"",(allocator *)&tdiBytes);
          std::allocator<char>::~allocator((allocator<char> *)&tdiBytes);
          return this;
        }
        *byInputBuffer =
             (BYTE)((int)(uint)*_dwNumBytesToRead >> (8U - ((char)tdi_local._4_4_ + -1) & 0x1f));
        *byInputBuffer =
             *byInputBuffer |
             (byte)((int)(uint)_dwNumBytesToRead[1] >> (7U - ((char)tdi_local._4_4_ + -1) & 0x1f));
        local_58 = 1;
        byOutputBuffer._4_4_ = 0;
      }
      else {
        local_80 = (BYTE *)operator_new__((ulong)((int)byOutputBuffer + 1));
        std::__cxx11::string::string((string *)&remBytes,(string *)in_RCX);
        hexToByte((string *)&remBytes,local_80);
        std::__cxx11::string::~string((string *)&remBytes);
        bct = tdi_local._4_4_ - 1 >> 3;
        i = 0;
        offset = bct;
        if (0x10000 < bct) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Large transfers with reads may not work!")
          ;
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        for (; bct != 0; bct = bct - local_b0) {
          if (bct < 0x10001) {
            local_32c = bct;
          }
          else {
            local_32c = 0x10000;
          }
          local_b0 = local_32c;
          *tdoBuffer = '9';
          tdoBuffer[1] = (char)local_32c + 0xff;
          tdoBuffer[2] = (BYTE)(local_32c - 1 >> 8);
          for (partialBits = 0; partialBits < local_32c; partialBits = partialBits + 1) {
            tdoBuffer[partialBits + 3] = local_80[partialBits + i];
          }
          byOutputBuffer._4_4_ = FT_Write(this_00->ftHandle,tdoBuffer,local_32c + 3,&dwNumBytesRead)
          ;
          if (byOutputBuffer._4_4_ != 0) {
            if (tdoBuffer != (BYTE *)0x0) {
              operator_delete(tdoBuffer,1);
            }
            if (byInputBuffer != (BYTE *)0x0) {
              operator_delete(byInputBuffer,1);
            }
            if (_dwNumBytesToRead != (byte *)0x0) {
              operator_delete(_dwNumBytesToRead,1);
            }
            if (local_80 != (BYTE *)0x0) {
              operator_delete(local_80,1);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)this,"",&local_b5);
            std::allocator<char>::~allocator((allocator<char> *)&local_b5);
            return this;
          }
          i = local_b0 + i;
          byOutputBuffer._4_4_ = 0;
        }
        bytesToRead = (tdi_local._4_4_ - 1) + offset * -8;
        if (offset * 8 + 1 != tdi_local._4_4_) {
          *tdoBuffer = ';';
          tdoBuffer[1] = (char)bytesToRead + 0xff;
          tdoBuffer[2] = local_80[(int)byOutputBuffer - 1];
          byOutputBuffer._4_4_ = FT_Write(this_00->ftHandle,tdoBuffer,3,&dwNumBytesRead);
          if (byOutputBuffer._4_4_ != 0) {
            if (tdoBuffer != (BYTE *)0x0) {
              operator_delete(tdoBuffer,1);
            }
            if (byInputBuffer != (BYTE *)0x0) {
              operator_delete(byInputBuffer,1);
            }
            if (_dwNumBytesToRead != (byte *)0x0) {
              operator_delete(_dwNumBytesToRead,1);
            }
            if (local_80 != (BYTE *)0x0) {
              operator_delete(local_80,1);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)this,"",&local_bd);
            std::allocator<char>::~allocator((allocator<char> *)&local_bd);
            return this;
          }
          byOutputBuffer._4_4_ = 0;
        }
        local_be = (byte)((int)(uint)local_80[(int)byOutputBuffer - 1] >>
                         ((char)tdi_local._4_4_ - 1U & 7)) & 1;
        *tdoBuffer = 'n';
        tdoBuffer[1] = '\0';
        tdoBuffer[2] = local_be << 7 | 3;
        byOutputBuffer._4_4_ = FT_Write(this_00->ftHandle,tdoBuffer,3,&dwNumBytesRead);
        if (byOutputBuffer._4_4_ != 0) {
          if (tdoBuffer != (BYTE *)0x0) {
            operator_delete(tdoBuffer,1);
          }
          if (byInputBuffer != (BYTE *)0x0) {
            operator_delete(byInputBuffer,1);
          }
          if (_dwNumBytesToRead != (byte *)0x0) {
            operator_delete(_dwNumBytesToRead,1);
          }
          if (local_80 != (BYTE *)0x0) {
            operator_delete(local_80,1);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)this,"",&local_bf);
          std::allocator<char>::~allocator((allocator<char> *)&local_bf);
          return this;
        }
        iVar6 = 1;
        if (offset * 8 + 1 != tdi_local._4_4_) {
          iVar6 = 2;
        }
        i_1 = offset + iVar6;
        byOutputBuffer._4_4_ = 0;
        do {
          byOutputBuffer._4_4_ = FT_GetQueueStatus(this_00->ftHandle,&tdoBytes);
          local_3a9 = tdoBytes != i_1 && byOutputBuffer._4_4_ == 0;
        } while (local_3a9);
        byOutputBuffer._4_4_ = FT_Read(this_00->ftHandle,_dwNumBytesToRead,tdoBytes,&reqHex);
        if (byOutputBuffer._4_4_ != 0) {
          if (tdoBuffer != (BYTE *)0x0) {
            operator_delete(tdoBuffer,1);
          }
          if (byInputBuffer != (BYTE *)0x0) {
            operator_delete(byInputBuffer,1);
          }
          if (_dwNumBytesToRead != (byte *)0x0) {
            operator_delete(_dwNumBytesToRead,1);
          }
          if (local_80 != (BYTE *)0x0) {
            operator_delete(local_80,1);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)this,"",&local_c5);
          std::allocator<char>::~allocator((allocator<char> *)&local_c5);
          return this;
        }
        for (local_cc = 0; local_cc < offset; local_cc = local_cc + 1) {
          byInputBuffer[local_58] = _dwNumBytesToRead[local_cc];
          local_58 = local_58 + 1;
        }
        if (offset * 8 + 1 == tdi_local._4_4_) {
          byInputBuffer[local_58] = (BYTE)((int)(uint)_dwNumBytesToRead[reqHex - 1] >> 7);
        }
        else {
          byInputBuffer[local_58] =
               (BYTE)((int)(uint)_dwNumBytesToRead[local_58] >> (8U - (char)bytesToRead & 0x1f));
          byInputBuffer[local_58] =
               byInputBuffer[local_58] |
               (byte)((int)(uint)_dwNumBytesToRead[reqHex - 1] >> (7U - (char)bytesToRead & 0x1f));
        }
        local_58 = local_58 + 1;
        if (local_80 != (BYTE *)0x0) {
          operator_delete(local_80,1);
        }
      }
      std::__cxx11::stringstream::stringstream(local_258);
      local_25c = local_58;
      while (local_25c = local_25c + -1, -1 < local_25c) {
        local_25d = (char)std::setfill<char>('0');
        poVar3 = std::operator<<(local_248,local_25d);
        local_264 = (int)std::setw(2);
        poVar3 = std::operator<<(poVar3,(_Setw)local_264);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
        std::ostream::operator<<(poVar3,(uint)byInputBuffer[local_25c]);
      }
      local_265 = 0;
      std::__cxx11::stringstream::str();
      lVar4 = std::__cxx11::string::length();
      lVar5 = std::__cxx11::string::length();
      if (lVar4 + -1 == lVar5) {
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_288,(ulong)this);
        std::__cxx11::string::operator=((string *)this,local_288);
        std::__cxx11::string::~string(local_288);
      }
      if (tdoBuffer != (BYTE *)0x0) {
        operator_delete(tdoBuffer,1);
      }
      if (byInputBuffer != (BYTE *)0x0) {
        operator_delete(byInputBuffer,1);
      }
      if (_dwNumBytesToRead != (byte *)0x0) {
        operator_delete(_dwNumBytesToRead,1);
      }
      local_265 = 1;
      std::__cxx11::stringstream::~stringstream(local_258);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"",&local_6d);
      std::allocator<char>::~allocator((allocator<char> *)&local_6d);
    }
  }
  return this;
}

Assistant:

string Jtag::shiftData(unsigned int bitCount, string tdi) {
	FT_STATUS ftStatus;
	unsigned int reqBytes = bitCount / 8 + (bitCount % 8 > 0);
	BYTE *byOutputBuffer = new BYTE[reqBytes + 3];
	BYTE *tdoBuffer = new BYTE[reqBytes + 3];
	BYTE *byInputBuffer = new BYTE[reqBytes + 6];
	DWORD dwNumBytesSent = 0;
	DWORD dwNumBytesToRead = 0;
	DWORD dwNumBytesRead = 0;
	DWORD tdoBytes = 0;

	unsigned int reqHex = bitCount / 4 + (bitCount % 4 > 0);

	if (tdi.length() < reqHex)
		return "";

	if (!flush())
		return "";

	if (bitCount < 9) {
		int data = stoi(tdi, 0, 16);
		byOutputBuffer[0] = 0x3B;
		byOutputBuffer[1] = bitCount - 2;
		byOutputBuffer[2] = data & 0xff;
		ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			return "";
		}

		BYTE lastBit = (data >> ((bitCount - 1) % 8)) & 0x01;

		byOutputBuffer[0] = 0x6E;
		byOutputBuffer[1] = 0x00;
		byOutputBuffer[2] = 0x03 | (lastBit << 7);
		ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			return "";
		}

		do {
			ftStatus = FT_GetQueueStatus(ftHandle, &dwNumBytesToRead);
			// Get the number of bytes in the device input buffer
		} while ((dwNumBytesToRead == 0) && (ftStatus == FT_OK));
		//or Timeout
		ftStatus = FT_Read(ftHandle, byInputBuffer, dwNumBytesToRead,
				&dwNumBytesRead);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			return "";
		}

		tdoBuffer[0] = byInputBuffer[0] >> (8 - (bitCount - 1));
		tdoBuffer[0] |= byInputBuffer[1] >> (7 - (bitCount - 1));
		tdoBytes = 1;

	} else {
		BYTE *tdiBytes = new BYTE[reqBytes + 1];
		hexToByte(tdi, tdiBytes);

		unsigned int fullBytes = (bitCount - 1) / 8;
		unsigned int remBytes = fullBytes;
		unsigned int offset = 0;

		if (fullBytes > 65536) {
			cout << "Large transfers with reads may not work!" << endl;
		}

		while (remBytes > 0) {
			unsigned int bct = remBytes > 65536 ? 65536 : remBytes;
			byOutputBuffer[0] = 0x39;
			byOutputBuffer[1] = (bct - 1) & 0xff;
			byOutputBuffer[2] = ((bct - 1) >> 8) & 0xff;

			for (unsigned int i = 0; i < bct; i++) {
				byOutputBuffer[3 + i] = tdiBytes[i + offset];
			}

			ftStatus = FT_Write(ftHandle, byOutputBuffer, 3 + bct,
					&dwNumBytesSent);
			if (ftStatus != FT_OK) {
				delete byOutputBuffer;
				delete tdoBuffer;
				delete byInputBuffer;
				delete tdiBytes;
				return "";
			}

			remBytes -= bct;
			offset += bct;
		}

		unsigned int partialBits = bitCount - 1 - (fullBytes * 8);

		if (fullBytes * 8 + 1 != bitCount) {
			byOutputBuffer[0] = 0x3B;
			byOutputBuffer[1] = partialBits - 1;
			byOutputBuffer[2] = tdiBytes[reqBytes - 1] & 0xff;
			ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
			if (ftStatus != FT_OK) {
				delete byOutputBuffer;
				delete tdoBuffer;
				delete byInputBuffer;
				delete tdiBytes;
				return "";
			}
		}

		BYTE lastBit = (tdiBytes[reqBytes - 1] >> ((bitCount - 1) % 8)) & 0x01;

		byOutputBuffer[0] = 0x6E;
		byOutputBuffer[1] = 0x00;
		byOutputBuffer[2] = 0x03 | (lastBit << 7);
		ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			delete tdiBytes;
			return "";
		}

		DWORD bytesToRead = fullBytes
				+ ((fullBytes * 8 + 1 != bitCount) ? 2 : 1);
		do {
			ftStatus = FT_GetQueueStatus(ftHandle, &dwNumBytesToRead);
			// Get the number of bytes in the device input buffer
		} while ((dwNumBytesToRead != bytesToRead) && (ftStatus == FT_OK));
		//or Timeout
		ftStatus = FT_Read(ftHandle, byInputBuffer, dwNumBytesToRead,
				&dwNumBytesRead);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			delete tdiBytes;
			return "";
		}

		for (unsigned int i = 0; i < fullBytes; i++)
			tdoBuffer[tdoBytes++] = byInputBuffer[i];

		if (fullBytes * 8 + 1 != bitCount) {
			tdoBuffer[tdoBytes] = byInputBuffer[tdoBytes] >> (8 - partialBits);
			tdoBuffer[tdoBytes++] |= byInputBuffer[dwNumBytesRead - 1]
					>> (7 - partialBits);
		} else {
			tdoBuffer[tdoBytes++] = byInputBuffer[dwNumBytesRead - 1] >> 7;
		}

		delete tdiBytes;
	}

	//Read out the data from input buffer
	std::stringstream ss;
	for (int i = tdoBytes - 1; i >= 0; i--)
		ss << setfill('0') << setw(2) << hex << (int) tdoBuffer[i];
	string hexTdo = ss.str();
	if (hexTdo.length() - 1 == tdi.length())
		hexTdo = hexTdo.substr(1, hexTdo.length() - 1);

	delete byOutputBuffer;
	delete tdoBuffer;
	delete byInputBuffer;
	return hexTdo;
}